

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CS248::OSDText::set_size(OSDText *this,int line_id,size_t size)

{
  bool bVar1;
  pointer pOVar2;
  size_t in_RDX;
  int in_ESI;
  __normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
  *in_RDI;
  iterator it;
  vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
  local_20;
  size_t local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_20._M_current =
       (OSDLine *)
       std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::begin
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::end(in_stack_ffffffffffffffc8);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) {
      return;
    }
    pOVar2 = __gnu_cxx::
             __normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
             ::operator->(&local_20);
    if (pOVar2->id == local_c) break;
    __gnu_cxx::
    __normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
    ::operator++(&local_20);
  }
  pOVar2 = __gnu_cxx::
           __normal_iterator<CS248::OSDLine_*,_std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>_>
           ::operator->(&local_20);
  pOVar2->size = local_18;
  return;
}

Assistant:

void OSDText::set_size(int line_id, size_t size) {
  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    if(it->id == line_id) {
      it->size = size;
      break;
    }
    ++it;
  }
}